

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpDisassemble::OnOpcodeBlockSig
          (BinaryReaderObjdumpDisassemble *this,Type sig_type)

{
  char *pcVar1;
  size_t data_size;
  allocator local_3d;
  Type local_3c;
  string local_38;
  
  data_size = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
               super_BinaryReaderDelegate.state)->offset - this->current_opcode_offset;
  if (sig_type.enum_ == Void) {
    LogOpcode(this,data_size,(char *)0x0);
  }
  else {
    local_3c.enum_ = sig_type.enum_;
    if (sig_type.enum_ < Any) {
      pcVar1 = Type::GetName(&local_3c);
      std::__cxx11::string::string((string *)&local_38,pcVar1,&local_3d);
    }
    else {
      StringPrintf_abi_cxx11_(&local_38,"type[%d]",(ulong)(uint)sig_type.enum_);
    }
    LogOpcode(this,data_size,"%s",local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  this->indent_level = this->indent_level + 1;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeBlockSig(Type sig_type) {
  Offset immediate_len = state->offset - current_opcode_offset;
  if (sig_type != Type::Void) {
    LogOpcode(immediate_len, "%s", BlockSigToString(sig_type).c_str());
  } else {
    LogOpcode(immediate_len, nullptr);
  }
  indent_level++;
  return Result::Ok;
}